

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
__thiscall
Js::Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Utf8SourceInfo *this,Recycler *recycler)

{
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> **ppLVar1
  ;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *ptr;
  Recycler *recycler_local;
  Utf8SourceInfo *this_local;
  
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->topLevelFunctionInfoList);
  if (*ppLVar1 ==
      (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    ptr = JsUtil::
          List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
          New(recycler,4);
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::operator=(&this->topLevelFunctionInfoList,ptr);
  }
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->topLevelFunctionInfoList);
  return *ppLVar1;
}

Assistant:

JsUtil::List<FunctionInfo *, Recycler> *
    Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Recycler * recycler)
    {
        if (this->topLevelFunctionInfoList == nullptr)
        {
            this->topLevelFunctionInfoList = JsUtil::List<FunctionInfo *, Recycler>::New(recycler);
        }
        return this->topLevelFunctionInfoList;
    }